

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O0

void __thiscall
boost::numeric::ublas::
mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
::erase_element(mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
                *this,size_type i,size_type j)

{
  bool bVar1;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *this_00;
  iterator in_RDI;
  subiterator_type it;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffc0;
  _Self local_30;
  size_type local_28;
  _Self local_20 [4];
  
  this_00 = &data((mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
                   *)in_RDI._M_node)->
             super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  ;
  local_28 = basic_row_major<unsigned_long,_long>::element
                       (in_stack_ffffffffffffffc0,(size_type)in_RDI._M_node,(size_type)this_00,
                        (size_type)in_stack_ffffffffffffffa8);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
       ::find(in_stack_ffffffffffffffa8,(key_type *)0xaa2079);
  data((mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
        *)in_RDI._M_node);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
       ::end(in_stack_ffffffffffffffa8);
  bVar1 = std::operator==(local_20,&local_30);
  if (!bVar1) {
    data((mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
          *)in_RDI._M_node);
    std::
    map<unsigned_long,double,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,double>>>
    ::erase_abi_cxx11_(this_00,in_RDI);
  }
  return;
}

Assistant:

BOOST_UBLAS_INLINE
        void erase_element (size_type i, size_type j) {
            subiterator_type it = data ().find (layout_type::element (i, size1_, j, size2_));
            if (it == data ().end ())
                return;
            data ().erase (it);
        }